

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O0

string * __thiscall
hexpattern::datamask2regex_abi_cxx11_
          (string *__return_storage_ptr__,hexpattern *this,ByteMaskType *datamask)

{
  value_type vVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  byte *pbVar6;
  string local_c0;
  int local_9c;
  string local_98;
  int local_74;
  uint local_70;
  int c;
  string local_68;
  uint local_38;
  undefined1 local_31;
  uint i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *mask;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  ByteMaskType *datamask_local;
  hexpattern *this_local;
  string *regex;
  
  _i = &datamask->second;
  local_31 = 0;
  mask = &datamask->first;
  data = &datamask->first;
  datamask_local = (ByteMaskType *)this;
  this_local = (hexpattern *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_38 = 0; uVar3 = (ulong)local_38,
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(mask), uVar3 < sVar4;
      local_38 = local_38 + 1) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (_i,(ulong)local_38);
    vVar1 = *pvVar5;
    if (vVar1 == '\0') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,".");
    }
    else if (vVar1 == '\x0f') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"[");
      for (local_74 = 0; iVar2 = local_74, local_74 < 0x100; local_74 = local_74 + 0x10) {
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (mask,(ulong)local_38);
        local_9c = iVar2 + (*pbVar6 & 0xf);
        stringformat<int>(&local_98,"\\x%02x",&local_9c);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"]");
    }
    else if (vVar1 == 0xf0) {
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (mask,(ulong)local_38);
      c = *pbVar6 & 0xfffffff0;
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (mask,(ulong)local_38);
      local_70 = *pbVar6 | 0xf;
      stringformat<int,int>(&local_68,"[\\x%02x-\\x%02x]",&c,(int *)&local_70);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else if (vVar1 == 0xff) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (mask,(ulong)local_38);
      stringformat<unsigned_char_const&>(&local_c0,"\\x%02x",pvVar5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string datamask2regex(const ByteMaskType & datamask)
    {
        auto & data = datamask.first;
        auto & mask = datamask.second;

        std::string regex;
        for (unsigned i = 0 ; i < data.size() ; i++)
        {
            switch(mask[i])
            {
                case 0: regex += "."; break;
                case 0xF0: regex += stringformat("[\\x%02x-\\x%02x]", data[i] & 0xF0, (data[i] & 0xF0) | 0x0F); break;
                case 0x0F:
                           {
                               regex += "[";
                               for (int c = 0 ; c < 0x100 ; c += 0x10)
                                   regex += stringformat("\\x%02x", c + (data[i] & 0x0F));
                               regex += "]";
                           }
                           break;
                case 0xFF: regex += stringformat("\\x%02x", data[i]); break;
            }
        }

        return regex;
    }